

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_shm_latency.cpp
# Opt level: O2

void parent(void)

{
  pointer pcVar1;
  int iVar2;
  Writer *__p;
  Reader *__p_00;
  ostream *poVar3;
  int i;
  int iVar4;
  allocator_type local_269;
  shared_ptr<diffusion::Reader> in_reader;
  vector<char,_std::allocator<char>_> data;
  shared_ptr<diffusion::Writer> out_writer;
  vector<char,_std::allocator<char>_> recv;
  timespec last_message_recv_time;
  timespec first_message_send_time;
  Message message;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message,"diffusion_latency_test_out",(allocator<char> *)&data);
  __p = diffusion::create_shared_memory_writer((string *)&message,0x1000000);
  std::__shared_ptr<diffusion::Writer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<diffusion::Writer,void>
            ((__shared_ptr<diffusion::Writer,(__gnu_cxx::_Lock_policy)2> *)&out_writer,__p);
  std::__cxx11::string::~string((string *)&message);
  message.pad[0] = 'd';
  message.pad[1] = '\0';
  message.pad[2] = '\0';
  message.pad[3] = '\0';
  message.pad[4] = '\0';
  message.pad[5] = '\0';
  message.pad[6] = '\0';
  message.pad[7] = '\0';
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)&message);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message,"diffusion_latency_test_in",(allocator<char> *)&data);
  __p_00 = diffusion::create_shared_memory_reader((string *)&message);
  std::__shared_ptr<diffusion::Reader,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<diffusion::Reader,void>
            ((__shared_ptr<diffusion::Reader,(__gnu_cxx::_Lock_policy)2> *)&in_reader,__p_00);
  std::__cxx11::string::~string((string *)&message);
  message.is_last_message = false;
  message.num_passes = 0;
  clock_gettime(0,(timespec *)&first_message_send_time);
  diffusion::to_vector_char(&data,message.pad,0x1e8);
  std::vector<char,_std::allocator<char>_>::vector(&recv,0x1e8,&local_269);
  for (iVar4 = 1;
      pcVar1 = data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start, iVar4 != 1000000; iVar4 = iVar4 + 1) {
    (**(out_writer.super___shared_ptr<diffusion::Writer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       _vptr_Writer)(out_writer.super___shared_ptr<diffusion::Writer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&data);
    do {
      iVar2 = (**(in_reader.super___shared_ptr<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->_vptr_Reader)();
    } while ((char)iVar2 == '\0');
    (*(in_reader.super___shared_ptr<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_Reader[2])(in_reader.super___shared_ptr<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,&data);
    *(int *)(data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start + 0x1e0) =
         *(int *)(data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start + 0x1e0) + 1;
  }
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [0x1e4] = '\x01';
  (**(out_writer.super___shared_ptr<diffusion::Writer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_Writer)();
  do {
    iVar4 = (**(in_reader.super___shared_ptr<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->_vptr_Reader)();
  } while ((char)iVar4 == '\0');
  (*(in_reader.super___shared_ptr<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Reader[2])(in_reader.super___shared_ptr<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&data);
  *(int *)(data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start + 0x1e0) =
       *(int *)(data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                ._M_start + 0x1e0) + 1;
  clock_gettime(0,(timespec *)&last_message_recv_time);
  std::operator<<((ostream *)&std::cout,"First message send time: ");
  print(&first_message_send_time);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"Last message recv time : ");
  print(&last_message_recv_time);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar3 = std::operator<<((ostream *)&std::cout,"Number of message passes = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(pcVar1 + 0x1e0));
  std::endl<char,std::char_traits<char>>(poVar3);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&recv.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&data.super__Vector_base<char,_std::allocator<char>_>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&in_reader.super___shared_ptr<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&out_writer.super___shared_ptr<diffusion::Writer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void parent() {
    auto out_writer = std::shared_ptr<diffusion::Writer>(diffusion::create_shared_memory_writer(shm_out_name, shm_size));
    std::this_thread::sleep_for(std::chrono::milliseconds(100));
    auto in_reader = std::shared_ptr<diffusion::Reader>(diffusion::create_shared_memory_reader(shm_in_name));
    Message message;
    message.is_last_message = false;
    message.num_passes = 0;
    ::timespec first_message_send_time;
    ::timespec last_message_recv_time;
    ::clock_gettime(CLOCK_REALTIME, &first_message_send_time);
    auto data = diffusion::to_vector_char(reinterpret_cast<char const *>(&message), sizeof(message));
    std::vector<char> recv(sizeof(Message));
    for (int i = 1; i < times; ++i) {
        out_writer->write(data);
        while (true) {
            if (in_reader->can_read()) {
                in_reader->read(data);
                auto message_pointer = reinterpret_cast<Message *>(data.data());
                ++message_pointer->num_passes;
                break;
            }
        }
    }
    auto message_pointer = reinterpret_cast<Message *>(data.data());
    message_pointer->is_last_message = true;
    out_writer->write(data);
    while (true) {
        if (in_reader->can_read()) {
            in_reader->read(data);
            auto message_pointer = reinterpret_cast<Message *>(data.data());
            ++message_pointer->num_passes;
            break;
        }
    }
    ::clock_gettime(CLOCK_REALTIME, &last_message_recv_time);
    std::cout << "First message send time: "; print(first_message_send_time); std::cout << std::endl;
    std::cout << "Last message recv time : "; print(last_message_recv_time); std::cout << std::endl;
    std::cout << "Number of message passes = " << message_pointer->num_passes << std::endl;
}